

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O0

Llb_Grp_t * Llb_ManGroupCreateLast(Llb_Man_t *pMan)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Llb_Grp_t *pLVar2;
  void *Entry;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Llb_Grp_t *p;
  Llb_Man_t *pMan_local;
  
  pLVar2 = Llb_ManGroupAlloc(pMan);
  for (local_24 = 0; iVar1 = Saig_ManRegNum(pMan->pAig), local_24 < iVar1; local_24 = local_24 + 1)
  {
    p_00 = pMan->pAig->vCos;
    iVar1 = Saig_ManPoNum(pMan->pAig);
    Entry = Vec_PtrEntry(p_00,local_24 + iVar1);
    Vec_PtrPush(pLVar2->vIns,Entry);
  }
  return pLVar2;
}

Assistant:

Llb_Grp_t * Llb_ManGroupCreateLast( Llb_Man_t * pMan )
{
    Llb_Grp_t * p;
    Aig_Obj_t * pObj;
    int i;
    p = Llb_ManGroupAlloc( pMan );
    Saig_ManForEachLi( pMan->pAig, pObj, i )
        Vec_PtrPush( p->vIns, pObj );
    return p;
}